

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ppu.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2dae49::PpuTest_ignore_oamdata_during_pre_render_scanline_Test::
PpuTest_ignore_oamdata_during_pre_render_scanline_Test
          (PpuTest_ignore_oamdata_during_pre_render_scanline_Test *this)

{
  PpuTest_ignore_oamdata_during_pre_render_scanline_Test *this_local;
  
  PpuTest::PpuTest(&this->super_PpuTest);
  (this->super_PpuTest).super_Test._vptr_Test =
       (_func_int **)&PTR__PpuTest_ignore_oamdata_during_pre_render_scanline_Test_003f8b20;
  return;
}

Assistant:

TEST_F(PpuTest, ignore_oamdata_during_pre_render_scanline) {
    registers.mask = PpuMask(0b00011000);
    registers.oamaddr = 0x02;
    registers.scanline = 261;
    registers.odd_frame = true;
    expected.mask = registers.mask;
    expected.oamaddr = registers.oamaddr;
    expected.scanline = 0;
    expected.odd_frame = false;
    // Two increases when fetching two tiles for next scanline
    expected.vram_addr = PpuVram(0x0002);

    step_execution(kCyclesPerScanline);

    ppu->write_byte(0x2004, 0x73);

    EXPECT_EQ(expected, registers);
}